

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

void __thiscall tokenizer::read_string(tokenizer *this)

{
  string *this_00;
  char __c;
  uint uVar1;
  Token_Type type;
  
  this_00 = &this->current_word;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,'\"');
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  do {
    __c = *this->line_char;
    if (__c == '\\') {
      if (this->line_char[1] != '\"') goto LAB_0010a334;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this_00,'\"');
      uVar1 = this->position_number;
      this->position_number = uVar1 + 1;
      this->line_char = this->line_char + 2;
      uVar1 = uVar1 + 2;
    }
    else {
      if (__c == '\0') {
        type = invalid;
        goto LAB_0010a368;
      }
      if (__c == '\"') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,'\"');
        type = string;
LAB_0010a368:
        add_token_to_stream(this,type);
        this->line_char = this->line_char + 1;
        this->position_number = this->position_number + 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
        return;
      }
LAB_0010a334:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this_00,__c);
      this->line_char = this->line_char + 1;
      uVar1 = this->position_number + 1;
    }
    this->position_number = uVar1;
  } while( true );
}

Assistant:

void tokenizer::read_string() {
    current_word += '"';
    bool gotEndQuote = false;

    last_position_number = position_number;
    last_line_number = line_number;

    while(*line_char != '\0') {
        if(*line_char == '"') {
            current_word += '"';
            gotEndQuote = true;
            break;
        }
        else if(*line_char == '\\' && *(line_char + 1) == '"') {
            current_word += '"';
            this->advance_to_next_character();
            this->advance_to_next_character();
        }
        else {
            current_word += *line_char;
            this->advance_to_next_character();
        }
    }

    if(gotEndQuote) {
        this->add_token_to_stream(Token_Type::string);
    }
    else {
        this->add_token_to_stream(Token_Type::invalid);
    }

    this->advance_to_next_character();
    //position_number += current_word.length() + 3;
    current_word = "";
}